

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O1

void __thiscall
amrex::DeriveRec::getRange(DeriveRec *this,int k,int *state_indx,int *src_comp,int *num_comp)

{
  bool bVar1;
  StateRange *pSVar2;
  bool bVar3;
  
  pSVar2 = this->rng;
  bVar3 = pSVar2 != (StateRange *)0x0;
  if (0 < k && bVar3) {
    do {
      pSVar2 = pSVar2->next;
      bVar3 = pSVar2 != (StateRange *)0x0;
      if (pSVar2 == (StateRange *)0x0) break;
      bVar1 = 1 < k;
      k = k + -1;
    } while (bVar1);
  }
  if (bVar3) {
    *state_indx = pSVar2->typ;
    *src_comp = pSVar2->sc;
    *num_comp = pSVar2->nc;
  }
  return;
}

Assistant:

void
DeriveRec::getRange (int  k,
                     int& state_indx,
                     int& src_comp,
                     int& num_comp) const
{
    StateRange* r;

    for (r = rng; r != 0 && k > 0; k--, r = r->next)
        ;
    BL_ASSERT(r != 0);
    if (r != 0) {
        state_indx = r->typ;
        src_comp   = r->sc;
        num_comp   = r->nc;
    }
}